

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_hugehelp.c
# Opt level: O0

void showhelp(char *trigger,char *arg,char *endarg)

{
  _Bool _Var1;
  int iVar2;
  uchar *buf_00;
  size_t len;
  scan_ctx ctx;
  z_stream z;
  int status;
  uchar *buf;
  char *endarg_local;
  char *arg_local;
  char *trigger_local;
  
  inithelpscan((scan_ctx *)&len,trigger,arg,endarg);
  memset(&ctx.show,0,0x70);
  ctx._256_8_ = (long)hugehelpgz + 10;
  iVar2 = inflateInit2_(&ctx.show,0xfffffff1,"1.2.11",0x70);
  if (iVar2 == 0) {
    buf_00 = (uchar *)malloc(0x10000);
    if (buf_00 != (uchar *)0x0) {
      do {
        iVar2 = inflate(&ctx.show,2);
        if (((iVar2 != 0) && (iVar2 != 1)) || (_Var1 = helpscan(buf_00,0,(scan_ctx *)&len), !_Var1))
        break;
      } while (iVar2 != 1);
      free(buf_00);
    }
    inflateEnd(&ctx.show);
  }
  return;
}

Assistant:

void showhelp(const char *trigger, const char *arg, const char *endarg)
{
  unsigned char *buf;
  int status;
  z_stream z;
  struct scan_ctx ctx;
  inithelpscan(&ctx, trigger, arg, endarg);

  /* Make sure no gzip options are set */
  if(hugehelpgz[3] & 0xfe)
    return;

  memset(&z, 0, sizeof(z_stream));
  z.zalloc = (alloc_func)zalloc_func;
  z.zfree = (free_func)zfree_func;
  z.avail_in = (unsigned int)(sizeof(hugehelpgz) - HEADERLEN);
  z.next_in = (unsigned char *)hugehelpgz + HEADERLEN;

  if(inflateInit2(&z, -MAX_WBITS) != Z_OK)
    return;

  buf = malloc(BUF_SIZE);
  if(buf) {
    while(1) {
      z.avail_out = BUF_SIZE;
      z.next_out = buf;
      status = inflate(&z, Z_SYNC_FLUSH);
      if(status == Z_OK || status == Z_STREAM_END) {
        size_t len = BUF_SIZE - z.avail_out;
        if(!helpscan(buf, len, &ctx))
          break;
        if(status == Z_STREAM_END)
          break;
      }
      else
        break;    /* error */
    }
    free(buf);
  }
  inflateEnd(&z);
}